

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xml_attribute __thiscall pugi::xml_node::append_copy(xml_node *this,xml_attribute *proto)

{
  bool bVar1;
  xml_node_type parent;
  xml_allocator *this_00;
  xml_attribute_struct *attr;
  xml_attribute_struct *in_RSI;
  xml_attribute_struct *in_RDI;
  xml_attribute a;
  xml_allocator *alloc;
  xml_attribute in_stack_ffffffffffffffd8;
  xml_attribute_struct *da;
  xml_attribute local_8;
  
  da = in_RDI;
  bVar1 = xml_attribute::operator!((xml_attribute *)in_RSI);
  if (bVar1) {
    xml_attribute::xml_attribute(&local_8);
  }
  else {
    parent = type((xml_node *)in_RDI);
    bVar1 = impl::anon_unknown_0::allow_insert_attribute(parent);
    if (bVar1) {
      this_00 = impl::anon_unknown_0::get_allocator<pugi::xml_node_struct>
                          ((xml_node_struct *)in_RDI->header);
      bVar1 = impl::anon_unknown_0::xml_allocator::reserve(this_00);
      if (bVar1) {
        attr = impl::anon_unknown_0::allocate_attribute(in_stack_ffffffffffffffd8._attr);
        xml_attribute::xml_attribute((xml_attribute *)&stack0xffffffffffffffd8,attr);
        bVar1 = xml_attribute::operator!((xml_attribute *)&stack0xffffffffffffffd8);
        if (bVar1) {
          xml_attribute::xml_attribute(&local_8);
        }
        else {
          impl::anon_unknown_0::append_attribute
                    (in_stack_ffffffffffffffd8._attr,(xml_node_struct *)in_RDI->header);
          impl::anon_unknown_0::node_copy_attribute(da,in_RSI);
          local_8._attr = in_stack_ffffffffffffffd8._attr;
        }
      }
      else {
        xml_attribute::xml_attribute(&local_8);
      }
    }
    else {
      xml_attribute::xml_attribute(&local_8);
    }
  }
  return (xml_attribute)local_8._attr;
}

Assistant:

PUGI_IMPL_FN xml_attribute xml_node::append_copy(const xml_attribute& proto)
	{
		if (!proto) return xml_attribute();
		if (!impl::allow_insert_attribute(type())) return xml_attribute();

		impl::xml_allocator& alloc = impl::get_allocator(_root);
		if (!alloc.reserve()) return xml_attribute();

		xml_attribute a(impl::allocate_attribute(alloc));
		if (!a) return xml_attribute();

		impl::append_attribute(a._attr, _root);
		impl::node_copy_attribute(a._attr, proto._attr);

		return a;
	}